

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

InternalKey * __thiscall leveldb::InternalKey::DebugString_abi_cxx11_(InternalKey *this)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RSI;
  Slice local_200;
  leveldb local_1f0 [48];
  ostringstream local_1c0 [8];
  ostringstream ss;
  Slice local_48;
  undefined1 local_38 [8];
  ParsedInternalKey parsed;
  InternalKey *this_local;
  
  ParsedInternalKey::ParsedInternalKey((ParsedInternalKey *)local_38);
  Slice::Slice(&local_48,in_RSI);
  bVar1 = ParseInternalKey(&local_48,(ParsedInternalKey *)local_38);
  if (bVar1) {
    ParsedInternalKey::DebugString_abi_cxx11_((ParsedInternalKey *)this);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar2 = std::operator<<((ostream *)local_1c0,"(bad)");
    Slice::Slice(&local_200,in_RSI);
    EscapeString_abi_cxx11_(local_1f0,&local_200);
    std::operator<<(poVar2,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1c0);
  }
  return this;
}

Assistant:

std::string InternalKey::DebugString() const {
  ParsedInternalKey parsed;
  if (ParseInternalKey(rep_, &parsed)) {
    return parsed.DebugString();
  }
  std::ostringstream ss;
  ss << "(bad)" << EscapeString(rep_);
  return ss.str();
}